

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_791d::TENSOR_INITIALIZING_2_Test::~TENSOR_INITIALIZING_2_Test
          (TENSOR_INITIALIZING_2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TENSOR, INITIALIZING_2) {
        tensor<int, 2> ts({
                                  {1,2,3},
                                  {4,5,6}
                          }, {2,3});
        EXPECT_EQ((ts[{0,0}]), 1);
        EXPECT_EQ((ts[{0,2}]), 3);
        EXPECT_EQ((ts[{1,1}]), 5);
    }